

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O2

void __thiscall
testing::internal::UnorderedElementsAreMatcherImplBase::DescribeNegationToImpl
          (UnorderedElementsAreMatcherImplBase *this,ostream *os)

{
  long lVar1;
  long *plVar2;
  ostream *poVar3;
  char *pcVar4;
  size_t i;
  long lVar5;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  lVar5 = *(long *)this;
  lVar1 = *(long *)&this->field_0x8;
  if (lVar5 != lVar1) {
    poVar3 = std::operator<<(os,"doesn\'t have ");
    if (lVar1 - lVar5 == 8) {
      Elements((UnorderedElementsAreMatcherImplBase *)&local_40,1);
      poVar3 = testing::operator<<(poVar3,(Message *)&local_40);
      poVar3 = std::operator<<(poVar3,", or has ");
      Elements((UnorderedElementsAreMatcherImplBase *)&local_38,1);
      poVar3 = testing::operator<<(poVar3,(Message *)&local_38);
      std::operator<<(poVar3," that ");
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_38);
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_40);
      (**(code **)(*(long *)**(undefined8 **)this + 0x18))((long *)**(undefined8 **)this,os);
    }
    else {
      Elements((UnorderedElementsAreMatcherImplBase *)&local_40,
               *(long *)&this->field_0x8 - *(long *)this >> 3);
      poVar3 = testing::operator<<(poVar3,(Message *)&local_40);
      std::operator<<(poVar3,", or there exists no permutation of elements such that:\n");
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_40);
      pcVar4 = "";
      for (lVar5 = 0; lVar5 != *(long *)&this->field_0x8 - *(long *)this >> 3; lVar5 = lVar5 + 1) {
        poVar3 = std::operator<<(os,pcVar4);
        poVar3 = std::operator<<(poVar3," - element #");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::operator<<(poVar3," ");
        plVar2 = *(long **)(*(long *)this + lVar5 * 8);
        (**(code **)(*plVar2 + 0x10))(plVar2,os);
        pcVar4 = ", and\n";
      }
    }
    return;
  }
  std::operator<<(os,"isn\'t empty");
  return;
}

Assistant:

void UnorderedElementsAreMatcherImplBase::DescribeNegationToImpl(
    ::std::ostream* os) const {
  if (matcher_describers_.empty()) {
    *os << "isn't empty";
    return;
  }
  if (matcher_describers_.size() == 1) {
    *os << "doesn't have " << Elements(1)
        << ", or has " << Elements(1) << " that ";
    matcher_describers_[0]->DescribeNegationTo(os);
    return;
  }
  *os << "doesn't have " << Elements(matcher_describers_.size())
      << ", or there exists no permutation of elements such that:\n";
  const char* sep = "";
  for (size_t i = 0; i != matcher_describers_.size(); ++i) {
    *os << sep << " - element #" << i << " ";
    matcher_describers_[i]->DescribeTo(os);
    sep = ", and\n";
  }
}